

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

int __thiscall p2t::Triangle::Index(Triangle *this,Point *p)

{
  Point *p_local;
  Triangle *this_local;
  
  if (p == this->points_[0]) {
    this_local._4_4_ = 0;
  }
  else if (p == this->points_[1]) {
    this_local._4_4_ = 1;
  }
  else {
    if (p != this->points_[2]) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                    ,0xa2,"int p2t::Triangle::Index(const Point *)");
    }
    this_local._4_4_ = 2;
  }
  return this_local._4_4_;
}

Assistant:

int Triangle::Index(const Point* p)
{
  if (p == points_[0]) {
    return 0;
  } else if (p == points_[1]) {
    return 1;
  } else if (p == points_[2]) {
    return 2;
  }
  assert(0);
  return -1;
}